

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O1

void __thiscall
ans_fold_encode<6U>::encode_symbol
          (ans_fold_encode<6U> *this,uint64_t *state,uint32_t sym,uint8_t **out_u8)

{
  pointer peVar1;
  ushort uVar2;
  uint8_t *puVar3;
  pointer peVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint32_t uVar8;
  
  iVar7 = 0;
  if (0x1fff < sym) {
    iVar7 = 0;
    uVar8 = sym;
    do {
      puVar3 = *out_u8;
      *out_u8 = puVar3 + 1;
      *puVar3 = (uint8_t)uVar8;
      sym = uVar8 >> 8;
      iVar7 = iVar7 + 0x1fe0;
      bVar6 = 0x1fffff < uVar8;
      uVar8 = sym;
    } while (bVar6);
  }
  peVar4 = (this->table).super__Vector_base<enc_entry_fold,_std::allocator<enc_entry_fold>_>._M_impl
           .super__Vector_impl_data._M_start;
  peVar1 = peVar4 + (iVar7 + sym);
  uVar5 = *state;
  if (peVar4[iVar7 + sym].sym_upper_bound <= uVar5) {
    puVar3 = *out_u8;
    *(int *)puVar3 = (int)uVar5;
    *out_u8 = puVar3 + 4;
    *state = uVar5 >> 0x20;
  }
  uVar2 = peVar1->freq;
  *state = (ulong)peVar1->base + *state % (ulong)uVar2 + (*state / (ulong)uVar2) * this->frame_size;
  return;
}

Assistant:

void encode_symbol(uint64_t& state, uint32_t sym, uint8_t*& out_u8)
    {
        auto mapped_sym
            = ans_fold_mapping_and_exceptions<fidelity>(sym, out_u8);
        const auto& e = table[mapped_sym];
        if (state >= e.sym_upper_bound) {
            auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
            *out_ptr_u32 = state & 0xFFFFFFFF;
            out_u8 += sizeof(uint32_t);
            state = state >> constants::RADIX_LOG2;
        }
        state = ((state / e.freq) * frame_size) + (state % e.freq) + e.base;
    }